

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O1

void __thiscall muduo::ThreadPool::start(ThreadPool *this,int numThreads)

{
  ulong uVar1;
  pointer *ppuVar2;
  pointer pcVar3;
  iterator __position;
  ulong uVar4;
  Thread *this_00;
  vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
  *this_01;
  char id [32];
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  ulong local_90;
  ulong local_88;
  _Head_base<0UL,_muduo::Thread_*,_false> local_80;
  string local_78;
  char local_58 [40];
  
  this->running_ = true;
  this_01 = &this->threads_;
  std::
  vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
  ::reserve(this_01,(long)numThreads);
  if (0 < numThreads) {
    local_90 = (ulong)(uint)numThreads;
    uVar4 = 0;
    do {
      uVar1 = uVar4 + 1;
      local_88 = uVar4;
      snprintf(local_58,0x20,"%d",uVar1 & 0xffffffff);
      this_00 = (Thread *)operator_new(0xd0);
      local_b8._M_unused._M_object = (void *)0x0;
      local_b8._8_8_ = 0;
      local_a8 = (code *)0x0;
      pcStack_a0 = (code *)0x0;
      local_b8._M_unused._M_object = operator_new(0x18);
      *(code **)local_b8._M_unused._0_8_ = runInThread;
      *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = 0;
      *(ThreadPool **)((long)local_b8._M_unused._0_8_ + 0x10) = this;
      pcStack_a0 = std::
                   _Function_handler<void_(),_std::_Bind<void_(muduo::ThreadPool::*(muduo::ThreadPool_*))()>_>
                   ::_M_invoke;
      local_a8 = std::
                 _Function_handler<void_(),_std::_Bind<void_(muduo::ThreadPool::*(muduo::ThreadPool_*))()>_>
                 ::_M_manager;
      pcVar3 = (this->name_)._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar3,pcVar3 + (this->name_)._M_string_length);
      std::__cxx11::string::append((char *)&local_78);
      Thread::Thread(this_00,(ThreadFunc *)&local_b8,&local_78);
      __position._M_current =
           (this->threads_).
           super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_80._M_head_impl = this_00;
      if (__position._M_current ==
          (this->threads_).
          super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::unique_ptr<muduo::Thread,std::default_delete<muduo::Thread>>,std::allocator<std::unique_ptr<muduo::Thread,std::default_delete<muduo::Thread>>>>
        ::_M_realloc_insert<muduo::Thread*>
                  ((vector<std::unique_ptr<muduo::Thread,std::default_delete<muduo::Thread>>,std::allocator<std::unique_ptr<muduo::Thread,std::default_delete<muduo::Thread>>>>
                    *)this_01,__position,&local_80._M_head_impl);
      }
      else {
        ((__position._M_current)->_M_t).
        super___uniq_ptr_impl<muduo::Thread,_std::default_delete<muduo::Thread>_>._M_t.
        super__Tuple_impl<0UL,_muduo::Thread_*,_std::default_delete<muduo::Thread>_>.
        super__Head_base<0UL,_muduo::Thread_*,_false>._M_head_impl = this_00;
        ppuVar2 = &(this->threads_).
                   super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar2 = *ppuVar2 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if (local_a8 != (code *)0x0) {
        (*local_a8)(&local_b8,&local_b8,__destroy_functor);
      }
      Thread::start((Thread *)
                    (this_01->
                    super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[local_88]._M_t.
                    super___uniq_ptr_impl<muduo::Thread,_std::default_delete<muduo::Thread>_>);
      uVar4 = uVar1;
    } while (local_90 != uVar1);
  }
  if ((numThreads == 0) &&
     ((this->threadInitCallback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    (*(this->threadInitCallback_)._M_invoker)((_Any_data *)&this->threadInitCallback_);
  }
  return;
}

Assistant:

void ThreadPool::start(int numThreads)
{
  assert(threads_.empty());
  running_ = true;
  threads_.reserve(numThreads);
  for (int i = 0; i < numThreads; ++i)
  {
    char id[32];
    snprintf(id, sizeof id, "%d", i+1);
    threads_.emplace_back(new muduo::Thread(
          std::bind(&ThreadPool::runInThread, this), name_+id));
    threads_[i]->start();
  }
  if (numThreads == 0 && threadInitCallback_)
  {
    threadInitCallback_();
  }
}